

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_update_state(AV1_COMP *cpi,ThreadData *td,PICK_MODE_CONTEXT *ctx,int mi_row,int mi_col,
                     BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  void *__dest;
  uint8_t ref_frame_type;
  byte bVar1;
  CFL_ALLOWED_TYPE CVar2;
  int iVar3;
  uint do_update;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint x_mis_00;
  uint y_mis_00;
  AV1_COMMON *cm_00;
  CommonModeInfoParams *mi_params_00;
  AV1_COMP *cpi_00;
  AV1_COMMON *cm_01;
  long lVar8;
  int in_ECX;
  MB_MODE_INFO *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  byte in_stack_00000008;
  int y_mis;
  int x_mis;
  int rows;
  int cols;
  int mi_y;
  int ymis;
  MV mv;
  uint8_t tmp_pred_ctx;
  int use_tmp_pred;
  int pred_segment_id;
  int64_t spatial_cost;
  uint8_t coded_id;
  uint8_t spatial_pred;
  int cdf_num;
  uint8_t *map;
  int blk_row;
  int mi_stride;
  uint8_t *tx_type_map;
  int grid_idx;
  TxfmSearchInfo *txfm_info;
  int mi_height;
  int mi_width;
  int mis;
  int bh;
  int bw;
  segmentation *seg;
  MB_MODE_INFO *mi_addr;
  MB_MODE_INFO *mi;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int num_planes;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  int y;
  int x_idx;
  int i;
  MV_REFERENCE_FRAME *in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint local_120;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  MACROBLOCKD *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int local_e8;
  undefined4 in_stack_ffffffffffffff1c;
  BLOCK_SIZE bsize_00;
  undefined2 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff22;
  short sVar9;
  undefined2 in_stack_ffffffffffffff24;
  short sVar10;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  AV1_COMP *in_stack_ffffffffffffff30;
  int local_c4;
  MACROBLOCKD *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  RUN_TYPE dry_run_00;
  long in_stack_ffffffffffffff50;
  int local_30;
  int local_2c;
  int local_28;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  mi_params_00 = (CommonModeInfoParams *)(in_RDI + 0x3c188);
  iVar3 = av1_num_planes(cm_00);
  __dest = (void *)**(undefined8 **)(in_RSI + 0x2058);
  cpi_00 = (AV1_COMP *)(in_RDI + 0x409b8);
  x_mis_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [in_RDX->bsize];
  y_mis_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [in_RDX->bsize];
  iVar7 = *(int *)(in_RDI + 0x3c1c4);
  do_update = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [in_R9B];
  uVar6 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R9B]
  ;
  memcpy(__dest,in_RDX,0xb0);
  cm_01 = (AV1_COMMON *)(in_RSI + 0x3c70);
  ref_frame_type = av1_ref_frame_type(in_stack_fffffffffffffeb8);
  copy_mbmi_ext_frame_to_mbmi_ext
            ((MB_MODE_INFO_EXT *)cm_01,(MB_MODE_INFO_EXT_FRAME *)(in_RDX + 1),ref_frame_type);
  iVar4._0_1_ = in_RDX[2].interintra_mode;
  iVar4._1_1_ = in_RDX[2].interintra_wedge_index;
  iVar4._2_2_ = *(undefined2 *)&in_RDX[2].field_0x42;
  memcpy((void *)(in_RSI + 0x24e09),*(void **)(in_RDX[1].palette_mode_info.palette_colors + 5),
         (long)iVar4);
  bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff1c >> 0x18);
  *(byte *)(in_RSI + 0x24e08) = (byte)in_RDX[2].palette_mode_info.palette_colors[5];
  *(undefined8 *)(in_RSI + 0x2088) = *(undefined8 *)&in_RDX[2].wm_params.gamma;
  *(uint *)(in_RSI + 0x2090) =
       (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R9B];
  if (in_stack_00000008 == 0) {
    iVar4 = get_mi_grid_idx(mi_params_00,in_ECX,in_R8D);
    in_stack_ffffffffffffff50 = *(long *)(in_RDI + 0x3c1c8) + (long)iVar4;
    iVar4 = *(int *)(in_RDI + 0x3c1c4);
    for (in_stack_ffffffffffffff48 = 0;
        bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff1c >> 0x18),
        in_stack_ffffffffffffff48 < (int)y_mis_00;
        in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 + 1) {
      memcpy((void *)(in_stack_ffffffffffffff50 + in_stack_ffffffffffffff48 * iVar4),
             (void *)(*(long *)(in_RSI + 0x2088) +
                     (long)(in_stack_ffffffffffffff48 * *(int *)(in_RSI + 0x2090))),
             (long)(int)x_mis_00);
    }
    *(long *)(in_RSI + 0x2088) = in_stack_ffffffffffffff50;
    *(int *)(in_RSI + 0x2090) = iVar4;
  }
  dry_run_00 = (RUN_TYPE)in_stack_ffffffffffffff50;
  if (*(char *)&cpi_00->ppi != '\0') {
    if (*(char *)(in_RDI + 0x42400) == '\x02') {
      if (*(char *)((long)&cpi_00->ppi + 1) == '\0') {
        in_stack_fffffffffffffef0 = *(MACROBLOCKD **)(in_RDI + 0x40a68);
      }
      else {
        in_stack_fffffffffffffef0 = *(MACROBLOCKD **)(in_RDI + 0x71298);
      }
      in_stack_ffffffffffffff40 = in_stack_fffffffffffffef0;
      if (in_stack_fffffffffffffef0 == (MACROBLOCKD *)0x0) {
        in_stack_fffffffffffffeec = 0;
      }
      else {
        bVar1 = get_segment_id(mi_params_00,(uint8_t *)in_stack_fffffffffffffef0,in_R9B,in_ECX,
                               in_R8D);
        in_stack_fffffffffffffeec = (uint)bVar1;
      }
      *(ushort *)((long)__dest + 0xa7) =
           *(ushort *)((long)__dest + 0xa7) & 0xfff8 | (byte)in_stack_fffffffffffffeec & 7;
    }
    if (((*(char *)(in_RDI + 0x42400) == '\x03') &&
        (((byte)*(undefined2 *)((long)__dest + 0xa7) & 7) != 7)) &&
       (*(int *)(in_RDI + 0x60870) == 0)) {
      in_stack_fffffffffffffec0 = (uint)*(byte *)(in_RSI + 0x24e08);
      in_stack_fffffffffffffec8 = (uint)in_stack_00000008;
      av1_cyclic_refresh_update_segment
                (in_stack_ffffffffffffff30,
                 (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 CONCAT13(in_stack_ffffffffffffff27,
                          CONCAT12(in_stack_ffffffffffffff26,in_stack_ffffffffffffff24)),
                 CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),bsize_00,
                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 (int64_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,dry_run_00);
    }
    if ((*(char *)((long)__dest + 3) == '\r') &&
       (CVar2 = is_cfl_allowed((MACROBLOCKD *)
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
       CVar2 == '\0')) {
      *(undefined1 *)((long)__dest + 3) = 0;
    }
    if ((in_stack_00000008 == 0) && (*(char *)((long)__dest + 0x90) == '\0')) {
      bVar1 = av1_get_spatial_seg_pred
                        (cm_01,in_stack_fffffffffffffef0,
                         (int *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                         in_stack_fffffffffffffee4);
      iVar4 = av1_neg_interleave((uint)((byte)*(undefined2 *)((long)__dest + 0xa7) & 7),(uint)bVar1,
                                 *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[9] + 2)
                                 + 1);
      lVar8 = (long)*(int *)(in_RSI + 0xb964 + (long)local_c4 * 0x20 + (ulong)(byte)iVar4 * 4);
      *(long *)(in_RSI + 0x25c48) = lVar8 + *(long *)(in_RSI + 0x25c48);
      if (*(long *)(in_RDI + 0x40a68) == 0) {
        bVar1 = 0;
      }
      else {
        bVar1 = get_segment_id(mi_params_00,*(uint8_t **)(in_RDI + 0x40a68),in_R9B,in_ECX,in_R8D);
      }
      uVar5 = (uint)(bVar1 == ((byte)*(undefined2 *)((long)__dest + 0xa7) & 7));
      bVar1 = av1_get_pred_context_seg_id((MACROBLOCKD *)(in_RSI + 0x1a0));
      *(long *)(in_RSI + 0x25c50) =
           (long)*(int *)(in_RSI + 0xb94c + (ulong)bVar1 * 8 + (long)(int)uVar5 * 4) +
           *(long *)(in_RSI + 0x25c50);
      if (uVar5 == 0) {
        *(long *)(in_RSI + 0x25c50) = lVar8 + *(long *)(in_RSI + 0x25c50);
      }
    }
  }
  if ((in_stack_00000008 == 0) && (iVar4 = frame_is_intra_only(cm_00), iVar4 == 0)) {
    sVar9 = in_RDX->mv[0].as_mv.row;
    sVar10 = in_RDX->mv[0].as_mv.col;
    iVar4 = is_inter_block((MB_MODE_INFO *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if ((iVar4 != 0) && (in_RDX->ref_frame[0] == '\x01')) {
      iVar4 = (int)sVar9;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar4 < 8) {
        iVar4 = (int)sVar10;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar4 < 8) {
          uVar5 = y_mis_00;
          if (*(int *)(in_RDI + 0x3c194) - in_ECX < (int)y_mis_00) {
            uVar5 = *(int *)(in_RDI + 0x3c194) - in_ECX;
          }
          for (local_e8 = 0; local_e8 < (int)uVar5; local_e8 = local_e8 + 2) {
            *(uint *)(in_RSI + 0x1523c) = x_mis_00 * 2 + *(int *)(in_RSI + 0x1523c);
          }
        }
      }
    }
  }
  for (local_28 = 0; local_28 < iVar3; local_28 = local_28 + 1) {
    *(undefined8 *)(in_RSI + (long)local_28 * 0x88 + 0x18) =
         *(undefined8 *)(in_RDX[1].palette_mode_info.palette_colors + (long)local_28 * 4 + 9);
    *(undefined8 *)(in_RSI + (long)local_28 * 0x88 + 0x10) =
         *(undefined8 *)(in_RDX[1].palette_mode_info.palette_size + (long)local_28 * 8 + -6);
    *(undefined8 *)(in_RSI + (long)local_28 * 0x88 + 8) =
         *(undefined8 *)(in_RDX[1].delta_lf + (long)local_28 * 8 + -3);
    *(undefined8 *)(in_RSI + (long)local_28 * 0x88 + 0x20) =
         *(undefined8 *)(in_RDX[2].mv + (long)local_28 * 2);
    *(undefined8 *)(in_RSI + (long)local_28 * 0x88 + 0x28) =
         *(undefined8 *)(in_RDX[2].wm_params.wmmat + (long)local_28 * 2 + 1);
  }
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    *(undefined8 *)(in_RSI + (long)local_28 * 0xa30 + 0x250) =
         *(undefined8 *)(in_RDX[1].angle_delta + (long)local_28 * 8);
  }
  local_120 = do_update;
  if ((int)((*(int *)(in_RSI + 0x2098) >> 5) + do_update) < (int)do_update) {
    local_120 = (*(int *)(in_RSI + 0x2098) >> 5) + do_update;
  }
  if ((int)((*(int *)(in_RSI + 0x20a0) >> 5) + uVar6) < (int)uVar6) {
    uVar6 = (*(int *)(in_RSI + 0x20a0) >> 5) + uVar6;
  }
  for (local_30 = 0; local_30 < (int)uVar6; local_30 = local_30 + 1) {
    for (local_2c = 0; local_2c < (int)local_120; local_2c = local_2c + 1) {
      *(void **)(*(long *)(in_RSI + 0x2058) + (long)(local_2c + local_30 * iVar7) * 8) = __dest;
    }
  }
  if (*(char *)(in_RDI + 0x42400) != '\0') {
    av1_init_plane_quantizers(cpi_00,(MACROBLOCK *)CONCAT44(x_mis_00,y_mis_00),iVar7,do_update);
  }
  if (in_stack_00000008 == 0) {
    iVar7 = frame_is_intra_only(cm_00);
    if (((iVar7 == 0) &&
        (iVar7 = is_inter_block((MB_MODE_INFO *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)),
        iVar7 != 0)) && (*(char *)(in_RDI + 0x3c179) == '\x04')) {
      update_filter_type_count
                ((FRAME_COUNTS *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    }
    if (*(int *)(in_RDI + 0x3c198) - in_R8D <= (int)x_mis_00) {
      x_mis_00 = *(int *)(in_RDI + 0x3c198) - in_R8D;
    }
    if (*(int *)(in_RDI + 0x3c194) - in_ECX <= (int)y_mis_00) {
      y_mis_00 = *(int *)(in_RDI + 0x3c194) - in_ECX;
    }
    if (*(int *)(*(long *)(in_RDI + 0x42008) + 0x34) != 0) {
      av1_copy_frame_mvs(cm_00,in_RDX,in_ECX,in_R8D,x_mis_00,y_mis_00);
    }
  }
  return;
}

Assistant:

void av1_update_state(const AV1_COMP *const cpi, ThreadData *td,
                      const PICK_MODE_CONTEXT *const ctx, int mi_row,
                      int mi_col, BLOCK_SIZE bsize, RUN_TYPE dry_run) {
  int i, x_idx, y;
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const MB_MODE_INFO *const mi = &ctx->mic;
  MB_MODE_INFO *const mi_addr = xd->mi[0];
  const struct segmentation *const seg = &cm->seg;
  assert(bsize < BLOCK_SIZES_ALL);
  const int bw = mi_size_wide[mi->bsize];
  const int bh = mi_size_high[mi->bsize];
  const int mis = mi_params->mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  assert(mi->bsize == bsize);

  *mi_addr = *mi;
  copy_mbmi_ext_frame_to_mbmi_ext(&x->mbmi_ext, &ctx->mbmi_ext_best,
                                  av1_ref_frame_type(ctx->mic.ref_frame));

  memcpy(txfm_info->blk_skip, ctx->blk_skip,
         sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);

  txfm_info->skip_txfm = ctx->rd_stats.skip_txfm;

  xd->tx_type_map = ctx->tx_type_map;
  xd->tx_type_map_stride = mi_size_wide[bsize];
  // If not dry_run, copy the transform type data into the frame level buffer.
  // Encoder will fetch tx types when writing bitstream.
  if (!dry_run) {
    const int grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
    uint8_t *const tx_type_map = mi_params->tx_type_map + grid_idx;
    const int mi_stride = mi_params->mi_stride;
    for (int blk_row = 0; blk_row < bh; ++blk_row) {
      av1_copy_array(tx_type_map + blk_row * mi_stride,
                     xd->tx_type_map + blk_row * xd->tx_type_map_stride, bw);
    }
    xd->tx_type_map = tx_type_map;
    xd->tx_type_map_stride = mi_stride;
  }

  // If segmentation in use
  if (seg->enabled) {
    // For in frame complexity AQ copy the segment id from the segment map.
    if (cpi->oxcf.q_cfg.aq_mode == COMPLEXITY_AQ) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mi_addr->segment_id =
          map ? get_segment_id(mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    // Else for cyclic refresh mode update the segment map, set the segment id
    // and then update the quantizer.
    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
        mi_addr->segment_id != AM_SEGMENT_ID_INACTIVE &&
        !cpi->rc.rtc_external_ratectrl) {
      av1_cyclic_refresh_update_segment(cpi, x, mi_row, mi_col, bsize,
                                        ctx->rd_stats.rate, ctx->rd_stats.dist,
                                        txfm_info->skip_txfm, dry_run);
    }
    if (mi_addr->uv_mode == UV_CFL_PRED && !is_cfl_allowed(xd))
      mi_addr->uv_mode = UV_DC_PRED;

    if (!dry_run && !mi_addr->skip_txfm) {
      int cdf_num;
      const uint8_t spatial_pred = av1_get_spatial_seg_pred(
          cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
      const uint8_t coded_id = av1_neg_interleave(
          mi_addr->segment_id, spatial_pred, seg->last_active_segid + 1);
      int64_t spatial_cost = x->mode_costs.spatial_pred_cost[cdf_num][coded_id];
      td->rd_counts.seg_tmp_pred_cost[0] += spatial_cost;

      const int pred_segment_id =
          cm->last_frame_seg_map
              ? get_segment_id(mi_params, cm->last_frame_seg_map, bsize, mi_row,
                               mi_col)
              : 0;
      const int use_tmp_pred = pred_segment_id == mi_addr->segment_id;
      const uint8_t tmp_pred_ctx = av1_get_pred_context_seg_id(xd);
      td->rd_counts.seg_tmp_pred_cost[1] +=
          x->mode_costs.tmp_pred_cost[tmp_pred_ctx][use_tmp_pred];
      if (!use_tmp_pred) {
        td->rd_counts.seg_tmp_pred_cost[1] += spatial_cost;
      }
    }
  }

  // Count zero motion vector.
  if (!dry_run && !frame_is_intra_only(cm)) {
    const MV mv = mi->mv[0].as_mv;
    if (is_inter_block(mi) && mi->ref_frame[0] == LAST_FRAME &&
        abs(mv.row) < 8 && abs(mv.col) < 8) {
      const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);
      // Accumulate low_content_frame.
      for (int mi_y = 0; mi_y < ymis; mi_y += 2) x->cnt_zeromv += bw << 1;
    }
  }

  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }
  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];
  // Restore the coding context of the MB to that that was in place
  // when the mode was picked for it

  const int cols =
      AOMMIN((xd->mb_to_right_edge >> (3 + MI_SIZE_LOG2)) + mi_width, mi_width);
  const int rows = AOMMIN(
      (xd->mb_to_bottom_edge >> (3 + MI_SIZE_LOG2)) + mi_height, mi_height);
  for (y = 0; y < rows; y++) {
    for (x_idx = 0; x_idx < cols; x_idx++) xd->mi[x_idx + y * mis] = mi_addr;
  }

  if (cpi->oxcf.q_cfg.aq_mode)
    av1_init_plane_quantizers(cpi, x, mi_addr->segment_id, 0);

  if (dry_run) return;

#if CONFIG_INTERNAL_STATS
  {
    unsigned int *const mode_chosen_counts =
        (unsigned int *)cpi->mode_chosen_counts;  // Cast const away.
    if (frame_is_intra_only(cm)) {
      static const int kf_mode_index[] = {
        THR_DC /*DC_PRED*/,
        THR_V_PRED /*V_PRED*/,
        THR_H_PRED /*H_PRED*/,
        THR_D45_PRED /*D45_PRED*/,
        THR_D135_PRED /*D135_PRED*/,
        THR_D113_PRED /*D113_PRED*/,
        THR_D157_PRED /*D157_PRED*/,
        THR_D203_PRED /*D203_PRED*/,
        THR_D67_PRED /*D67_PRED*/,
        THR_SMOOTH,   /*SMOOTH_PRED*/
        THR_SMOOTH_V, /*SMOOTH_V_PRED*/
        THR_SMOOTH_H, /*SMOOTH_H_PRED*/
        THR_PAETH /*PAETH_PRED*/,
      };
      ++mode_chosen_counts[kf_mode_index[mi_addr->mode]];
    } else {
      // Note how often each mode chosen as best
      ++mode_chosen_counts[ctx->best_mode_index];
    }
  }
#endif
  if (!frame_is_intra_only(cm)) {
    if (is_inter_block(mi) && cm->features.interp_filter == SWITCHABLE) {
      // When the frame interp filter is SWITCHABLE, several cases that always
      // use the default type (EIGHTTAP_REGULAR) are described in
      // av1_is_interp_needed(). Here, we should keep the counts for all
      // applicable blocks, so the frame filter resetting decision in
      // fix_interp_filter() is made correctly.
      update_filter_type_count(td->counts, xd, mi_addr);
    }
  }

  const int x_mis = AOMMIN(bw, mi_params->mi_cols - mi_col);
  const int y_mis = AOMMIN(bh, mi_params->mi_rows - mi_row);
  if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
    av1_copy_frame_mvs(cm, mi, mi_row, mi_col, x_mis, y_mis);
}